

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_triangle_from_direction
               (nk_vec2 *result,nk_rect r,float pad_x,float pad_y,nk_heading direction)

{
  nk_vec2 nVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar6;
  nk_vec2 nVar4;
  undefined1 auVar5 [16];
  float fVar7;
  float in_XMM2_Db;
  float fVar8;
  float in_XMM3_Db;
  
  auVar5._0_8_ = r._8_8_;
  auVar5._8_8_ = r._8_8_;
  if (result == (nk_vec2 *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x188e,
                  "void nk_triangle_from_direction(struct nk_vec2 *, struct nk_rect, float, float, enum nk_heading)"
                 );
  }
  auVar2._4_4_ = pad_y + pad_y;
  auVar2._0_4_ = pad_x + pad_x;
  auVar2._8_4_ = in_XMM2_Db + in_XMM2_Db;
  auVar2._12_4_ = in_XMM3_Db + in_XMM3_Db;
  auVar5 = maxps(auVar5,auVar2);
  fVar3 = auVar5._0_4_ - (pad_x + pad_x);
  fVar6 = auVar5._4_4_ - (pad_y + pad_y);
  fVar7 = pad_x + r.x;
  fVar8 = pad_y + r.y;
  if (direction == NK_DOWN) {
    result->x = fVar7;
    result->y = fVar8;
    result[1].x = fVar7 + fVar3;
    result[1].y = fVar8;
    nVar4.x = fVar3 * 0.5 + fVar7;
    nVar4.y = fVar6 + fVar8;
  }
  else {
    if (direction == NK_RIGHT) {
      result->x = fVar7;
      result->y = fVar8;
      result[1].x = fVar3 + fVar7;
      result[1].y = fVar6 * 0.5 + fVar8;
      nVar1.y = fVar8 + fVar6;
      nVar1.x = fVar7;
      result[2] = nVar1;
      return;
    }
    if (direction == NK_UP) {
      nVar4.y = fVar6 + fVar8;
      result->x = fVar7 + fVar3 * 0.5;
      result->y = fVar8;
      result[1].x = fVar3 + fVar7;
      result[1].y = nVar4.y;
      nVar4.x = fVar7;
    }
    else {
      nVar4.x = fVar3 + fVar7;
      result->x = fVar7;
      result->y = fVar6 * 0.5 + fVar8;
      result[1].x = nVar4.x;
      result[1].y = fVar8;
      nVar4.y = fVar8 + fVar6;
    }
  }
  result[2] = nVar4;
  return;
}

Assistant:

NK_API void
nk_triangle_from_direction(struct nk_vec2 *result, struct nk_rect r,
    float pad_x, float pad_y, enum nk_heading direction)
{
    float w_half, h_half;
    NK_ASSERT(result);

    r.w = NK_MAX(2 * pad_x, r.w);
    r.h = NK_MAX(2 * pad_y, r.h);
    r.w = r.w - 2 * pad_x;
    r.h = r.h - 2 * pad_y;

    r.x = r.x + pad_x;
    r.y = r.y + pad_y;

    w_half = r.w / 2.0f;
    h_half = r.h / 2.0f;

    if (direction == NK_UP) {
        result[0] = nk_vec2(r.x + w_half, r.y);
        result[1] = nk_vec2(r.x + r.w, r.y + r.h);
        result[2] = nk_vec2(r.x, r.y + r.h);
    } else if (direction == NK_RIGHT) {
        result[0] = nk_vec2(r.x, r.y);
        result[1] = nk_vec2(r.x + r.w, r.y + h_half);
        result[2] = nk_vec2(r.x, r.y + r.h);
    } else if (direction == NK_DOWN) {
        result[0] = nk_vec2(r.x, r.y);
        result[1] = nk_vec2(r.x + r.w, r.y);
        result[2] = nk_vec2(r.x + w_half, r.y + r.h);
    } else {
        result[0] = nk_vec2(r.x, r.y + h_half);
        result[1] = nk_vec2(r.x + r.w, r.y);
        result[2] = nk_vec2(r.x + r.w, r.y + r.h);
    }
}